

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.c
# Opt level: O0

_Bool rtosc_match_args(char *pattern,char *msg)

{
  char *msg_00;
  char *in_RSI;
  char *in_RDI;
  bool bVar1;
  _Bool arg_match;
  char *arg_str;
  _Bool local_22;
  _Bool local_21;
  char *local_10;
  _Bool local_1;
  
  local_10 = in_RDI + 1;
  if (*in_RDI == ':') {
    msg_00 = rtosc_argument_string(in_RSI);
    local_22 = true;
    if (*local_10 == '\0') {
      local_22 = *local_10 == *msg_00;
    }
    local_21 = local_22;
    while( true ) {
      bVar1 = false;
      if (*local_10 != '\0') {
        bVar1 = *local_10 != ':';
      }
      if (!bVar1) break;
      local_21 = (local_21 & *local_10 == *msg_00) != 0;
      msg_00 = msg_00 + 1;
      local_10 = local_10 + 1;
    }
    if (*local_10 == ':') {
      if ((local_21 == false) || (*msg_00 != '\0')) {
        local_1 = rtosc_match_args(in_RSI,msg_00);
      }
      else {
        local_1 = true;
      }
    }
    else {
      local_1 = local_21;
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

static bool rtosc_match_args(const char *pattern, const char *msg)
{
    //match anything if now arg restriction is present (ie the ':')
    if(*pattern++ != ':')
        return true;

    const char *arg_str = rtosc_argument_string(msg);
    bool      arg_match = *pattern || *pattern == *arg_str;

    while(*pattern && *pattern != ':')
        arg_match &= (*pattern++==*arg_str++);

    if(*pattern==':') {
        if(arg_match && !*arg_str)
            return true;
        else
            return rtosc_match_args(pattern, msg); //retry
    }

    return arg_match;
}